

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::ExpressionLHS<int>::GetResult
          (AssertionResult *__return_storage_ptr__,ExpressionLHS<int> *this,bool expected)

{
  AssertionResult *pAVar1;
  AssertionResult local_38;
  
  local_38.m_message._M_dataplus._M_p = (pointer)&local_38.m_message.field_2;
  local_38.m_message._M_string_length = 0;
  local_38.m_result = (this->m_lhs == 0) != expected;
  local_38.m_message.field_2._M_local_buf[0] = '\0';
  pAVar1 = AssertionResult::operator<<(&local_38,(char (*) [12])"expansion: ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&this->m_message);
  AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(bool expected) const
    {
        const bool b = m_lhs ? true : false;
        return AssertionResult(b == expected) << "expansion: " << m_message;
    }